

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7Dec.c
# Opt level: O3

int Ppmd7_DecodeSymbol(CPpmd7 *p,IPpmd7_RangeDec *rc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  ushort uVar5;
  ushort uVar6;
  Byte *pBVar7;
  CPpmd_State *pCVar8;
  UInt16 UVar9;
  UInt32 UVar10;
  int iVar11;
  CPpmd7_Context *pCVar12;
  CPpmd_See *pCVar13;
  uint uVar14;
  byte *pbVar15;
  long *plVar16;
  UInt32 UVar17;
  ulong uVar18;
  uint uVar19;
  uint numMasked;
  UInt16 *pUVar20;
  byte *pbVar21;
  UInt32 freqSum;
  size_t charMask [32];
  CPpmd_State *ps [256];
  uint local_944;
  IPpmd7_RangeDec *local_940;
  char local_938 [256];
  long local_838 [257];
  
  pCVar12 = p->MinContext;
  if (pCVar12->NumStats == 1) {
    bVar1 = *(byte *)((long)&pCVar12->SummFreq + 1);
    bVar2 = p->NS2BSIndx[(ulong)*(ushort *)(p->Base + pCVar12->Suffix) - 1];
    bVar3 = p->HB2Flag[p->FoundState->Symbol];
    p->HiBitsFlag = (uint)bVar3;
    pUVar20 = p->BinSumm[(ulong)bVar1 - 1] +
              (((uint)p->RunLength >> 0x1a & 0xffffffe0) +
              (uint)bVar2 + p->PrevSuccess + (uint)bVar3 +
              (uint)p->HB2Flag[(byte)pCVar12->SummFreq] * 2);
    UVar10 = (*rc->DecodeBit)(rc,(uint)*pUVar20);
    uVar5 = *pUVar20;
    if (UVar10 == 0) {
      *pUVar20 = (uVar5 - (short)(uVar5 + 0x20 >> 7)) + 0x80;
      p->FoundState = (CPpmd_State *)&p->MinContext->SummFreq;
      UVar9 = p->MinContext->SummFreq;
      Ppmd7_UpdateBin(p);
      return (uint)(byte)UVar9;
    }
    uVar14 = (uint)uVar5 - (uVar5 + 0x20 >> 7);
    *pUVar20 = (ushort)uVar14;
    p->InitEsc = (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
                       [(uVar14 & 0xffff) >> 10];
    memset(local_938,0xff,0x100);
    pCVar12 = p->MinContext;
    local_938[(byte)pCVar12->SummFreq] = '\0';
    p->PrevSuccess = 0;
  }
  else {
    pBVar7 = p->Base;
    uVar18 = (ulong)pCVar12->Stats;
    UVar10 = (*rc->GetThreshold)(rc,(uint)pCVar12->SummFreq);
    bVar1 = pBVar7[uVar18 + 1];
    if (UVar10 < bVar1) {
      (*rc->Decode)(rc,0,(uint)bVar1);
      p->FoundState = (CPpmd_State *)(pBVar7 + uVar18);
      bVar1 = ((CPpmd_State *)(pBVar7 + uVar18))->Symbol;
      Ppmd7_Update1_0(p);
      return (uint)bVar1;
    }
    p->PrevSuccess = 0;
    iVar11 = p->MinContext->NumStats - 1;
    pbVar15 = pBVar7 + (uVar18 - 6);
    uVar14 = (uint)bVar1;
    do {
      pbVar21 = pbVar15;
      UVar17 = uVar14 + pbVar21[0xd];
      if (UVar10 < UVar17) {
        (*rc->Decode)(rc,uVar14,(uint)pbVar21[0xd]);
        p->FoundState = (CPpmd_State *)(pbVar21 + 0xc);
        bVar1 = pbVar21[0xc];
        Ppmd7_Update1(p);
        return (uint)bVar1;
      }
      pbVar15 = pbVar21 + 6;
      iVar11 = iVar11 + -1;
      uVar14 = UVar17;
    } while (iVar11 != 0);
    uVar14 = (uint)p->MinContext->SummFreq;
    if (uVar14 <= UVar10) {
      return -2;
    }
    p->HiBitsFlag = (uint)p->HB2Flag[p->FoundState->Symbol];
    (*rc->Decode)(rc,UVar17,uVar14 - UVar17);
    memset(local_938,0xff,0x100);
    local_938[pbVar21[0xc]] = '\0';
    pCVar12 = p->MinContext;
    iVar11 = pCVar12->NumStats - 1;
    do {
      local_938[*pbVar15] = '\0';
      pbVar15 = pbVar15 + -6;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  while( true ) {
    uVar5 = pCVar12->NumStats;
    uVar14 = p->OrderFall;
    do {
      uVar18 = (ulong)pCVar12->Suffix;
      if (uVar18 == 0) {
        p->OrderFall = uVar14 + 1;
        return -1;
      }
      pBVar7 = p->Base;
      pCVar12 = (CPpmd7_Context *)(pBVar7 + uVar18);
      p->MinContext = pCVar12;
      uVar6 = *(ushort *)(pBVar7 + uVar18);
      uVar14 = uVar14 + 1;
    } while (uVar6 == uVar5);
    p->OrderFall = uVar14;
    pbVar15 = pBVar7 + pCVar12->Stats;
    numMasked = (uint)uVar5;
    uVar14 = 0;
    uVar18 = 0;
    do {
      cVar4 = local_938[*pbVar15];
      uVar14 = uVar14 + ((uint)pbVar15[1] & (int)cVar4);
      local_838[uVar18] = (long)pbVar15;
      pbVar15 = pbVar15 + 6;
      uVar19 = (int)uVar18 - (int)cVar4;
      uVar18 = (ulong)uVar19;
    } while (uVar19 != uVar6 - numMasked);
    local_940 = rc;
    pCVar13 = Ppmd7_MakeEscFreq(p,numMasked,&local_944);
    local_944 = local_944 + uVar14;
    UVar10 = (*local_940->GetThreshold)(local_940,local_944);
    rc = local_940;
    if (UVar10 < uVar14) break;
    if (local_944 <= UVar10) {
      return -2;
    }
    (*local_940->Decode)(local_940,uVar14,local_944 - uVar14);
    pCVar13->Summ = pCVar13->Summ + (short)local_944;
    iVar11 = numMasked - uVar6;
    plVar16 = local_838 + (~numMasked + (uint)uVar6);
    do {
      local_938[*(byte *)*plVar16] = '\0';
      plVar16 = plVar16 + -1;
      iVar11 = iVar11 + 1;
    } while (iVar11 != 0);
    pCVar12 = p->MinContext;
  }
  plVar16 = local_838;
  uVar14 = 0;
  do {
    UVar17 = uVar14;
    pCVar8 = (CPpmd_State *)*plVar16;
    uVar14 = UVar17 + pCVar8->Freq;
    plVar16 = plVar16 + 1;
  } while (uVar14 <= UVar10);
  (*local_940->Decode)(local_940,UVar17,(uint)pCVar8->Freq);
  bVar1 = pCVar13->Shift;
  if (bVar1 < 7) {
    pBVar7 = &pCVar13->Count;
    *pBVar7 = *pBVar7 + 0xff;
    if (*pBVar7 == '\0') {
      pCVar13->Summ = pCVar13->Summ << 1;
      pCVar13->Shift = bVar1 + 1;
      pCVar13->Count = (Byte)(3 << (bVar1 & 0x1f));
    }
  }
  p->FoundState = pCVar8;
  bVar1 = pCVar8->Symbol;
  Ppmd7_Update2(p);
  return (uint)bVar1;
}

Assistant:

int Ppmd7_DecodeSymbol(CPpmd7 *p, IPpmd7_RangeDec *rc)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 1)
  {
    CPpmd_State *s = Ppmd7_GetStats(p, p->MinContext);
    unsigned i;
    UInt32 count, hiCnt;
    if ((count = rc->GetThreshold(rc, p->MinContext->SummFreq)) < (hiCnt = s->Freq))
    {
      Byte symbol;
      rc->Decode(rc, 0, s->Freq);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update1_0(p);
      return symbol;
    }
    p->PrevSuccess = 0;
    i = p->MinContext->NumStats - 1;
    do
    {
      if ((hiCnt += (++s)->Freq) > count)
      {
        Byte symbol;
        rc->Decode(rc, hiCnt - s->Freq, s->Freq);
        p->FoundState = s;
        symbol = s->Symbol;
        Ppmd7_Update1(p);
        return symbol;
      }
    }
    while (--i);
    if (count >= p->MinContext->SummFreq)
      return -2;
    p->HiBitsFlag = p->HB2Flag[p->FoundState->Symbol];
    rc->Decode(rc, hiCnt, p->MinContext->SummFreq - hiCnt);
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats - 1;
    do { MASK((--s)->Symbol) = 0; } while (--i);
  }
  else
  {
    UInt16 *prob = Ppmd7_GetBinSumm(p);
    if (rc->DecodeBit(rc, *prob) == 0)
    {
      Byte symbol;
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      symbol = (p->FoundState = Ppmd7Context_OneState(p->MinContext))->Symbol;
      Ppmd7_UpdateBin(p);
      return symbol;
    }
    *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
    p->InitEsc = PPMD7_kExpEscape[*prob >> 10];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(Ppmd7Context_OneState(p->MinContext)->Symbol) = 0;
    p->PrevSuccess = 0;
  }
  for (;;)
  {
    CPpmd_State *ps[256], *s;
    UInt32 freqSum, count, hiCnt;
    CPpmd_See *see;
    unsigned i, num, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return -1;
      p->MinContext = Ppmd7_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    hiCnt = 0;
    s = Ppmd7_GetStats(p, p->MinContext);
    i = 0;
    num = p->MinContext->NumStats - numMasked;
    do
    {
      int k = (int)(MASK(s->Symbol));
      hiCnt += (s->Freq & k);
      ps[i] = s++;
      i -= k;
    }
    while (i != num);
    
    see = Ppmd7_MakeEscFreq(p, numMasked, &freqSum);
    freqSum += hiCnt;
    count = rc->GetThreshold(rc, freqSum);
    
    if (count < hiCnt)
    {
      Byte symbol;
      CPpmd_State **pps = ps;
      for (hiCnt = 0; (hiCnt += (*pps)->Freq) <= count; pps++);
      s = *pps;
      rc->Decode(rc, hiCnt - s->Freq, s->Freq);
      Ppmd_See_Update(see);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update2(p);
      return symbol;
    }
    if (count >= freqSum)
      return -2;
    rc->Decode(rc, hiCnt, freqSum - hiCnt);
    see->Summ = (UInt16)(see->Summ + freqSum);
    do { MASK(ps[--i]->Symbol) = 0; } while (i != 0);
  }
}